

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O0

int b_extract(lua_State *L)

{
  lua_Unsigned lVar1;
  int iVar2;
  int f;
  b_uint r;
  int w;
  lua_State *L_local;
  
  _r = L;
  lVar1 = luaL_checkunsigned(L,1);
  iVar2 = fieldargs(_r,2,&f);
  lua_pushunsigned(_r,lVar1 >> ((byte)iVar2 & 0x1f) & (-2 << ((char)f - 1U & 0x1f) ^ 0xffffffffU));
  return 1;
}

Assistant:

static int b_extract (lua_State *L) {
  int w;
  b_uint r = luaL_checkunsigned(L, 1);
  int f = fieldargs(L, 2, &w);
  r = (r >> f) & mask(w);
  lua_pushunsigned(L, r);
  return 1;
}